

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O0

uint8_t * __thiscall
icu_63::CollationKey::reallocate(CollationKey *this,int32_t newCapacity,int32_t length)

{
  uint8_t *__src;
  uint8_t *newBytes;
  int32_t length_local;
  int32_t newCapacity_local;
  CollationKey *this_local;
  
  this_local = (CollationKey *)uprv_malloc_63((long)newCapacity);
  if (this_local == (CollationKey *)0x0) {
    this_local = (CollationKey *)0x0;
  }
  else {
    if (0 < length) {
      __src = getBytes(this);
      memcpy(this_local,__src,(long)length);
    }
    if (this->fFlagAndLength < 0) {
      uprv_free_63((this->fUnion).fFields.fBytes);
    }
    (this->fUnion).fFields.fBytes = (uint8_t *)this_local;
    (this->fUnion).fFields.fCapacity = newCapacity;
    this->fFlagAndLength = this->fFlagAndLength | 0x80000000;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t *CollationKey::reallocate(int32_t newCapacity, int32_t length) {
    uint8_t *newBytes = static_cast<uint8_t *>(uprv_malloc(newCapacity));
    if(newBytes == NULL) { return NULL; }
    if(length > 0) {
        uprv_memcpy(newBytes, getBytes(), length);
    }
    if(fFlagAndLength < 0) { uprv_free(fUnion.fFields.fBytes); }
    fUnion.fFields.fBytes = newBytes;
    fUnion.fFields.fCapacity = newCapacity;
    fFlagAndLength |= 0x80000000;
    return newBytes;
}